

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O3

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,InterfacePortSymbol *symbol)

{
  flat_hash_set<const_DefinitionSymbol_*> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  DefinitionSymbol *pDVar4;
  ulong uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  ulong pos0;
  specific_symbol_iterator<slang::ast::MethodPrototypeSymbol> sVar9;
  value_type *elements;
  ulong hash;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  IfaceConn IVar19;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_(std::ranges::subrange_kind)0>
  sVar20;
  locator res;
  _Storage<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true> local_60;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  bVar8 = handleDefault<slang::ast::InterfacePortSymbol>(this,symbol);
  if (bVar8) {
    InterfacePortSymbol::getDeclaredRange
              ((optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> *)
               &local_60._M_value,symbol);
    pDVar4 = symbol->interfaceDef;
    if (pDVar4 != (DefinitionSymbol *)0x0) {
      arrays_ = &this->usedIfacePorts;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = pDVar4;
      hash = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
      pos0 = hash >> ((byte)(this->usedIfacePorts).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                            .arrays.groups_size_index & 0x3f);
      uVar3 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[hash & 0xff];
      uVar5 = (this->usedIfacePorts).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
              .arrays.groups_size_mask;
      uVar13 = 0;
      uVar12 = pos0;
      do {
        pgVar2 = (this->usedIfacePorts).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                 .arrays.groups_ + uVar12;
        local_48 = pgVar2->m[0].n;
        uStack_47 = pgVar2->m[1].n;
        uStack_46 = pgVar2->m[2].n;
        bStack_45 = pgVar2->m[3].n;
        uStack_44 = pgVar2->m[4].n;
        uStack_43 = pgVar2->m[5].n;
        uStack_42 = pgVar2->m[6].n;
        bStack_41 = pgVar2->m[7].n;
        uStack_40 = pgVar2->m[8].n;
        uStack_3f = pgVar2->m[9].n;
        uStack_3e = pgVar2->m[10].n;
        bStack_3d = pgVar2->m[0xb].n;
        uStack_3c = pgVar2->m[0xc].n;
        uStack_3b = pgVar2->m[0xd].n;
        uStack_3a = pgVar2->m[0xe].n;
        bStack_39 = pgVar2->m[0xf].n;
        uVar14 = (uchar)uVar3;
        auVar18[0] = -(local_48 == uVar14);
        uVar15 = (uchar)((uint)uVar3 >> 8);
        auVar18[1] = -(uStack_47 == uVar15);
        uVar16 = (uchar)((uint)uVar3 >> 0x10);
        auVar18[2] = -(uStack_46 == uVar16);
        bVar17 = (byte)((uint)uVar3 >> 0x18);
        auVar18[3] = -(bStack_45 == bVar17);
        auVar18[4] = -(uStack_44 == uVar14);
        auVar18[5] = -(uStack_43 == uVar15);
        auVar18[6] = -(uStack_42 == uVar16);
        auVar18[7] = -(bStack_41 == bVar17);
        auVar18[8] = -(uStack_40 == uVar14);
        auVar18[9] = -(uStack_3f == uVar15);
        auVar18[10] = -(uStack_3e == uVar16);
        auVar18[0xb] = -(bStack_3d == bVar17);
        auVar18[0xc] = -(uStack_3c == uVar14);
        auVar18[0xd] = -(uStack_3b == uVar15);
        auVar18[0xe] = -(uStack_3a == uVar16);
        auVar18[0xf] = -(bStack_39 == bVar17);
        for (uVar10 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe); uVar10 != 0;
            uVar10 = uVar10 - 1 & uVar10) {
          uVar6 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          if (pDVar4 == (this->usedIfacePorts).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                        .arrays.elements_[uVar12 * 0xf + (ulong)uVar6]) goto LAB_002e99ff;
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_39) == 0) break;
        lVar11 = uVar12 + uVar13;
        uVar13 = uVar13 + 1;
        uVar12 = lVar11 + 1U & uVar5;
      } while (uVar13 <= uVar5);
      if ((this->usedIfacePorts).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
          .size_ctrl.size <
          (this->usedIfacePorts).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<slang::ast::DefinitionSymbol_const*>>
        ::nosize_unchecked_emplace_at<slang::ast::DefinitionSymbol_const*const&>
                  ((locator *)&local_60._M_value,
                   (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<slang::ast::DefinitionSymbol_const*>>
                    *)arrays_,(arrays_type *)arrays_,pos0,hash,&symbol->interfaceDef);
        psVar1 = &(this->usedIfacePorts).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                  .size_ctrl.size;
        *psVar1 = *psVar1 + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<slang::ast::DefinitionSymbol_const*>>
        ::unchecked_emplace_with_rehash<slang::ast::DefinitionSymbol_const*const&>
                  ((locator *)&local_60._M_value,
                   (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<slang::ast::DefinitionSymbol_const*>>
                    *)arrays_,hash,&symbol->interfaceDef);
      }
LAB_002e99ff:
      if ((symbol->modport)._M_len != 0) {
        IVar19 = InterfacePortSymbol::getConnection(symbol);
        local_60._M_value._M_extent._M_extent_value =
             (__extent_storage<18446744073709551615UL>)IVar19.second;
        if (local_60._M_value._M_extent._M_extent_value != 0) {
          sVar20 = Scope::membersOfType<slang::ast::MethodPrototypeSymbol>
                             ((Scope *)((long)local_60._M_value._M_extent._M_extent_value + 0x40));
          sVar9 = sVar20._M_begin.current;
LAB_002e9a1f:
          if (sVar9.current != sVar20._M_end.current.current) {
            if ((sVar9.current[3].kind & Subroutine) != Unknown) {
              local_60._M_value._M_ptr = (pointer)symbol;
              SmallVectorBase<std::pair<slang::ast::InterfacePortSymbol_const*,slang::ast::ModportSymbol_const*>>
              ::
              emplace_back<std::pair<slang::ast::InterfacePortSymbol_const*,slang::ast::ModportSymbol_const*>>
                        ((SmallVectorBase<std::pair<slang::ast::InterfacePortSymbol_const*,slang::ast::ModportSymbol_const*>>
                          *)&this->modportsWithExports,
                         (pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>
                          *)&local_60._M_value);
              return;
            }
            do {
              sVar9.current = (sVar9.current)->nextInScope;
              if (sVar9.current == (Symbol *)0x0) {
                sVar9.current = (Symbol *)0x0;
                break;
              }
            } while ((sVar9.current)->kind != MethodPrototype);
            goto LAB_002e9a1f;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void handle(const InterfacePortSymbol& symbol) {
        if (!handleDefault(symbol))
            return;
        symbol.getDeclaredRange();

        if (symbol.interfaceDef) {
            usedIfacePorts.emplace(symbol.interfaceDef);

            // If this interface port specifies a modport and that
            // modport has export methods, store it in a list for later
            // processing and checking.
            if (!symbol.modport.empty()) {
                auto [_, modport] = symbol.getConnection();
                if (modport) {
                    for (auto& method : modport->membersOfType<MethodPrototypeSymbol>()) {
                        if (method.flags.has(MethodFlags::ModportExport)) {
                            modportsWithExports.push_back({&symbol, modport});
                            break;
                        }
                    }
                }
            }
        }
    }